

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O0

bool FIX::double_conversion::ConsumeSubString<unsigned_short_const*>
               (unsigned_short **current,unsigned_short *end,char *substring)

{
  char *local_28;
  char *substring_local;
  unsigned_short *end_local;
  unsigned_short **current_local;
  
  if ((uint)**current != (int)*substring) {
    __assert_fail("**current == *substring",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x1a9,
                  "bool FIX::double_conversion::ConsumeSubString(Iterator *, Iterator, const char *) [Iterator = const unsigned short *]"
                 );
  }
  local_28 = substring + 1;
  while( true ) {
    if (*local_28 == '\0') {
      *current = *current + 1;
      return true;
    }
    *current = *current + 1;
    if ((*current == end) || ((uint)**current != (int)*local_28)) break;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

static bool ConsumeSubString(Iterator* current,
                             Iterator end,
                             const char* substring) {
  ASSERT(**current == *substring);
  for (substring++; *substring != '\0'; substring++) {
    ++*current;
    if (*current == end || **current != *substring) return false;
  }
  ++*current;
  return true;
}